

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O2

void __thiscall OpenMD::Molecule::addAtom(Molecule *this,Atom *atom)

{
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  _Var1;
  Atom *local_10;
  
  local_10 = atom;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::Atom**,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Atom*const>>
                    ((this->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::push_back(&this->atoms_,&local_10)
    ;
  }
  return;
}

Assistant:

void Molecule::addAtom(Atom* atom) {
    if (std::find(atoms_.begin(), atoms_.end(), atom) == atoms_.end()) {
      atoms_.push_back(atom);
    }
  }